

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

uint __thiscall
nlohmann::detail::
serializer<nlohmann::basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::count_digits(serializer<nlohmann::basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
               *this,number_unsigned_t x)

{
  uint uVar1;
  
  uVar1 = 4;
  while( true ) {
    if (x < 10) {
      return uVar1 - 3;
    }
    if (x < 100) {
      return uVar1 - 2;
    }
    if (x < 1000) {
      return uVar1 - 1;
    }
    if (x < 10000) break;
    x = x / 10000;
    uVar1 = uVar1 + 4;
  }
  return uVar1;
}

Assistant:

inline unsigned int count_digits(number_unsigned_t x) noexcept
    {
        unsigned int n_digits = 1;
        for (;;)
        {
            if (x < 10)
            {
                return n_digits;
            }
            if (x < 100)
            {
                return n_digits + 1;
            }
            if (x < 1000)
            {
                return n_digits + 2;
            }
            if (x < 10000)
            {
                return n_digits + 3;
            }
            x = x / 10000u;
            n_digits += 4;
        }
    }